

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::PrimSpec::CopyFrom(PrimSpec *this,PrimSpec *rhs)

{
  this->_specifier = rhs->_specifier;
  ::std::__cxx11::string::_M_assign((string *)&this->_typeName);
  ::std::__cxx11::string::_M_assign((string *)&this->_name);
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::operator=
            (&this->_children,&rhs->_children);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::operator=(&(this->_props)._M_t,&(rhs->_props)._M_t);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&(this->_current_vsmap)._M_t,&(rhs->_current_vsmap)._M_t);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  ::operator=(&(this->_variantSets)._M_t,&(rhs->_variantSets)._M_t);
  std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->_primChildren,
             (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&rhs->_primChildren);
  std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->_properties,
             (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&rhs->_properties);
  std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&this->_variantChildren,
             (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&rhs->_variantChildren);
  PrimMetas::operator=(&this->_metas,&rhs->_metas);
  ::std::__cxx11::string::_M_assign((string *)&this->_current_working_path);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->_asset_search_paths,&rhs->_asset_search_paths);
  return;
}

Assistant:

void CopyFrom(const PrimSpec &rhs) {
    _specifier = rhs._specifier;
    _typeName = rhs._typeName;
    _name = rhs._name;

    _children = rhs._children;

    _props = rhs._props;

    //_vsmap = rhs._vsmap;
    _current_vsmap = rhs._current_vsmap;

    _variantSets = rhs._variantSets;

    _primChildren = rhs._primChildren;
    _properties = rhs._properties;
    _variantChildren = rhs._variantChildren;

    _metas = rhs._metas;

    _current_working_path = rhs._current_working_path;
    _asset_search_paths = rhs._asset_search_paths;
  }